

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinematic_chain.c
# Opt level: O3

void rev_ifk(kcc_joint *joint,mc_wrench *f,joint_torque *tau,int count)

{
  joint_torque *pjVar1;
  ulong uVar2;
  
  if (joint == (kcc_joint *)0x0) {
    __assert_fail("joint",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x134,
                  "void rev_ifk(const struct kcc_joint *, const struct mc_wrench *, joint_torque *, int)"
                 );
  }
  if (f != (mc_wrench *)0x0) {
    if (tau != (joint_torque *)0x0) {
      if (0 < count) {
        pjVar1 = (f->torque->field_0).data + (int)(joint->field_1).revolute_joint.axis;
        uVar2 = 0;
        do {
          tau[uVar2] = *pjVar1;
          uVar2 = uVar2 + 1;
          pjVar1 = pjVar1 + 3;
        } while ((uint)count != uVar2);
      }
      return;
    }
    __assert_fail("tau",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                  ,0x136,
                  "void rev_ifk(const struct kcc_joint *, const struct mc_wrench *, joint_torque *, int)"
                 );
  }
  __assert_fail("f",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/kinematic_chain.c"
                ,0x135,
                "void rev_ifk(const struct kcc_joint *, const struct mc_wrench *, joint_torque *, int)"
               );
}

Assistant:

static void rev_ifk(
        const struct kcc_joint *joint,
        const struct mc_wrench *f,
        joint_torque *tau,
        int count)
{
    assert(joint);
    assert(f);
    assert(tau);

    int k = joint->revolute_joint.axis;

    for (int i = 0; i < count; i++) {
        tau[i] = f->torque[i].data[k];
    }
}